

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_skeletons.cpp
# Opt level: O1

void icu_63::number::impl::enum_to_stem_string::signDisplay
               (UNumberSignDisplay value,UnicodeString *sb)

{
  switch(value) {
  case UNUM_SIGN_AUTO:
    UnicodeString::doAppend(sb,L"sign-auto",0,-1);
    break;
  case UNUM_SIGN_ALWAYS:
    UnicodeString::doAppend(sb,L"sign-always",0,-1);
    break;
  case UNUM_SIGN_NEVER:
    UnicodeString::doAppend(sb,L"sign-never",0,-1);
    break;
  case UNUM_SIGN_ACCOUNTING:
    UnicodeString::doAppend(sb,L"sign-accounting",0,-1);
    break;
  case UNUM_SIGN_ACCOUNTING_ALWAYS:
    UnicodeString::doAppend(sb,L"sign-accounting-always",0,-1);
    break;
  case UNUM_SIGN_EXCEPT_ZERO:
    UnicodeString::doAppend(sb,L"sign-except-zero",0,-1);
    break;
  case UNUM_SIGN_ACCOUNTING_EXCEPT_ZERO:
    UnicodeString::doAppend(sb,L"sign-accounting-except-zero",0,-1);
  }
  return;
}

Assistant:

void enum_to_stem_string::signDisplay(UNumberSignDisplay value, UnicodeString& sb) {
    switch (value) {
        case UNUM_SIGN_AUTO:
            sb.append(u"sign-auto", -1);
            break;
        case UNUM_SIGN_ALWAYS:
            sb.append(u"sign-always", -1);
            break;
        case UNUM_SIGN_NEVER:
            sb.append(u"sign-never", -1);
            break;
        case UNUM_SIGN_ACCOUNTING:
            sb.append(u"sign-accounting", -1);
            break;
        case UNUM_SIGN_ACCOUNTING_ALWAYS:
            sb.append(u"sign-accounting-always", -1);
            break;
        case UNUM_SIGN_EXCEPT_ZERO:
            sb.append(u"sign-except-zero", -1);
            break;
        case UNUM_SIGN_ACCOUNTING_EXCEPT_ZERO:
            sb.append(u"sign-accounting-except-zero", -1);
            break;
        default:
            U_ASSERT(false);
    }
}